

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O0

void __thiscall dh::scanner::debug(scanner *this)

{
  bool bVar1;
  TYPE TVar2;
  ostream *poVar3;
  size_type sVar4;
  pointer this_00;
  token local_70;
  string local_40 [8];
  string tmp_type;
  __normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_> local_20;
  __normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_> local_18;
  iterator i;
  scanner *this_local;
  
  i._M_current = (token *)this;
  if ((this->scanflag & 1U) == 0) {
    std::operator<<((ostream *)&std::cerr,"[ERROR] Token Sequence is not ready\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[INFO] Token Sries: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"[INFO] Size: ");
    sVar4 = std::vector<dh::token,_std::allocator<dh::token>_>::size(&this->_tokens);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_18._M_current =
         (token *)std::vector<dh::token,_std::allocator<dh::token>_>::begin(&this->_tokens);
    while( true ) {
      local_20._M_current =
           (token *)std::vector<dh::token,_std::allocator<dh::token>_>::end(&this->_tokens);
      bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      std::__cxx11::string::string(local_40);
      this_00 = __gnu_cxx::
                __normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_>
                ::operator->(&local_18);
      TVar2 = token::getType(this_00);
      switch(TVar2) {
      case BOOLEAN:
        std::__cxx11::string::operator=(local_40,"BOOLEAN");
        break;
      case VOID:
        std::__cxx11::string::operator=(local_40,"VOID");
        break;
      case INT:
        std::__cxx11::string::operator=(local_40,"INT");
        break;
      case FLOAT:
        std::__cxx11::string::operator=(local_40,"FLOAT");
        break;
      case BREAK:
        std::__cxx11::string::operator=(local_40,"BREAK");
        break;
      case CONTINUE:
        std::__cxx11::string::operator=(local_40,"CONTINUE");
        break;
      case ELSE:
        std::__cxx11::string::operator=(local_40,"ELSE");
        break;
      case FOR:
        std::__cxx11::string::operator=(local_40,"FOR");
        break;
      case IF:
        std::__cxx11::string::operator=(local_40,"IF");
        break;
      case RETURN:
        std::__cxx11::string::operator=(local_40,"RETURN");
        break;
      case WHILE:
        std::__cxx11::string::operator=(local_40,"WHILE");
        break;
      case ADDOP:
        std::__cxx11::string::operator=(local_40,"ADDOP");
        break;
      case MULOP:
        std::__cxx11::string::operator=(local_40,"MULOP");
        break;
      case RELOP:
        std::__cxx11::string::operator=(local_40,"RELOP");
        break;
      case EQUOP:
        std::__cxx11::string::operator=(local_40,"EQUOP");
        break;
      case ASSINGOP:
        std::__cxx11::string::operator=(local_40,"ASSINGOP");
        break;
      case LOGICALOP:
        std::__cxx11::string::operator=(local_40,"LOGICALOP");
        break;
      case STRING:
        std::__cxx11::string::operator=(local_40,"STRING");
        break;
      case ID:
        std::__cxx11::string::operator=(local_40,"ID");
        break;
      case SEPOP:
        std::__cxx11::string::operator=(local_40,"SEPOP");
        break;
      case NUMBOOLEAN:
        std::__cxx11::string::operator=(local_40,"NUMBOOLEAN");
      case NONES:
        break;
      case NUMINT:
        std::__cxx11::string::operator=(local_40,"NUMINT");
        break;
      case NUMFLOAT:
        std::__cxx11::string::operator=(local_40,"NUMFLOAT");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"{\t");
      __gnu_cxx::__normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_>
      ::operator->(&local_18);
      token::getVal_abi_cxx11_(&local_70);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      poVar3 = std::operator<<(poVar3,",\t");
      poVar3 = std::operator<<(poVar3,local_40);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_40);
      __gnu_cxx::__normal_iterator<dh::token_*,_std::vector<dh::token,_std::allocator<dh::token>_>_>
      ::operator++(&local_18);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[INFO] Token End");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void scanner::debug()
{
	if ( !scanflag)
	{
		::std::cerr << "[ERROR] Token Sequence is not ready\n";
		return;
	}

	::std::cout << "[INFO] Token Sries: " << ::std::endl;
	::std::cout << "[INFO] Size: " << _tokens.size() << ::std::endl;

	for(auto i = _tokens.begin(); i != _tokens.end(); ++i)
	{
		::std::string tmp_type;
		switch(i->getType())
		{
			case TYPE::BOOLEAN:
				tmp_type = "BOOLEAN";
				break;
			case TYPE::BREAK:
				tmp_type = "BREAK";
				break;
			case TYPE::CONTINUE:
				tmp_type = "CONTINUE";
				break;
			case TYPE::ELSE:
				tmp_type = "ELSE";
				break;
			case TYPE::FOR:
				tmp_type = "FOR";
				break;
			case TYPE::FLOAT:
				tmp_type = "FLOAT";
				break;
			case TYPE::IF:
				tmp_type = "IF";
				break;
			case TYPE::INT:
				tmp_type = "INT";
				break;
			case TYPE::RETURN:
				tmp_type = "RETURN";
				break;
			case TYPE::VOID:
				tmp_type = "VOID";
				break;
			case TYPE::WHILE:
				tmp_type = "WHILE";
				break;
			case TYPE::ADDOP:
				tmp_type = "ADDOP";
				break;
			case TYPE::MULOP:
				tmp_type = "MULOP";
				break;
			case TYPE::RELOP:
				tmp_type = "RELOP";
				break;
			case TYPE::EQUOP:
				tmp_type = "EQUOP";
				break;
			case TYPE::LOGICALOP:
				tmp_type = "LOGICALOP";
				break;
			case TYPE::ASSINGOP:
				tmp_type = "ASSINGOP";
				break;
			case TYPE::ID:
				tmp_type = "ID";
				break;
			case TYPE::SEPOP:
				tmp_type = "SEPOP";
				break;
			case TYPE::STRING:
				tmp_type = "STRING";
				break;
			case TYPE::NUMINT:
				tmp_type = "NUMINT";
				break;
			case TYPE::NUMFLOAT:
				tmp_type = "NUMFLOAT";
				break;
			case TYPE::NUMBOOLEAN:
				tmp_type = "NUMBOOLEAN";
			case TYPE::NONES:
				break;
		}
		::std::cout << "{\t" << i->getVal() << ",\t" << tmp_type << ::std::endl;
	}

	::std::cout << "[INFO] Token End" << ::std::endl;
}